

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall
SQFuncState::SQFuncState
          (SQFuncState *this,SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)

{
  SQTable *pSVar1;
  void *ed_local;
  CompilerErrorFunc efunc_local;
  SQFuncState *parent_local;
  SQSharedState *ss_local;
  SQFuncState *this_local;
  
  sqvector<SQLocalVarInfo>::sqvector(&this->_vlocals);
  sqvector<long_long>::sqvector(&this->_targetstack);
  sqvector<long_long>::sqvector(&this->_unresolvedbreaks);
  sqvector<long_long>::sqvector(&this->_unresolvedcontinues);
  sqvector<SQObjectPtr>::sqvector(&this->_functions);
  sqvector<SQObjectPtr>::sqvector(&this->_parameters);
  sqvector<SQOuterVar>::sqvector(&this->_outervalues);
  sqvector<SQInstruction>::sqvector(&this->_instructions);
  sqvector<SQLocalVarInfo>::sqvector(&this->_localvarinfos);
  ::SQObjectPtr::SQObjectPtr(&this->_literals);
  ::SQObjectPtr::SQObjectPtr(&this->_strings);
  ::SQObjectPtr::SQObjectPtr(&this->_name);
  ::SQObjectPtr::SQObjectPtr(&this->_sourcename);
  sqvector<SQLineInfo>::sqvector(&this->_lineinfos);
  sqvector<long_long>::sqvector(&this->_scope_blocks);
  sqvector<long_long>::sqvector(&this->_breaktargets);
  sqvector<long_long>::sqvector(&this->_continuetargets);
  sqvector<long_long>::sqvector(&this->_defaultparams);
  sqvector<SQFuncState_*>::sqvector(&this->_childstates);
  this->_nliterals = 0;
  pSVar1 = SQTable::Create(ss,0);
  ::SQObjectPtr::operator=(&this->_literals,pSVar1);
  pSVar1 = SQTable::Create(ss,0);
  ::SQObjectPtr::operator=(&this->_strings,pSVar1);
  this->_sharedstate = ss;
  this->_lastline = 0;
  this->_optimization = true;
  this->_parent = parent;
  this->_stacksize = 0;
  this->_traps = 0;
  this->_returnexp = 0;
  this->_varparams = false;
  this->_errfunc = efunc;
  this->_errtarget = ed;
  this->_bgenerator = false;
  this->_outers = 0;
  this->_ss = ss;
  return;
}

Assistant:

SQFuncState::SQFuncState(SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)
{
        _nliterals = 0;
        _literals = SQTable::Create(ss,0);
        _strings =  SQTable::Create(ss,0);
        _sharedstate = ss;
        _lastline = 0;
        _optimization = true;
        _parent = parent;
        _stacksize = 0;
        _traps = 0;
        _returnexp = 0;
        _varparams = false;
        _errfunc = efunc;
        _errtarget = ed;
        _bgenerator = false;
        _outers = 0;
        _ss = ss;

}